

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXCobraConnection.cpp
# Opt level: O0

void __thiscall ix::CobraConnection::~CobraConnection(CobraConnection *this)

{
  function<void_(ix::CobraConnectionEventType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ix::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_30;
  CobraConnection *local_10;
  CobraConnection *this_local;
  
  local_10 = this;
  disconnect(this);
  ::std::
  function<void_(ix::CobraConnectionEventType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ix::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_30,(nullptr_t)0x0);
  setEventCallback(this,&local_30);
  ::std::
  function<void_(ix::CobraConnectionEventType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ix::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_30);
  ::std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&this->_messageQueue);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_Json::Value_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_Json::Value_&)>_>_>_>
  ::~unordered_map(&this->_cbs);
  ::std::
  function<void_(ix::CobraConnectionEventType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ix::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&this->_eventCallback);
  Json::FastWriter::~FastWriter(&this->_jsonWriter);
  Json::Value::~Value(&this->_pdu);
  Json::Value::~Value(&this->_body);
  ::std::__cxx11::string::~string((string *)&this->_roleSecret);
  ::std::__cxx11::string::~string((string *)&this->_roleName);
  ::std::unique_ptr<ix::WebSocket,_std::default_delete<ix::WebSocket>_>::~unique_ptr
            (&this->_webSocket);
  return;
}

Assistant:

CobraConnection::~CobraConnection()
    {
        disconnect();
        setEventCallback(nullptr);
    }